

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O2

void ncnn::quantize(float *ptr,char *s8ptr,float scale,int size)

{
  int iVar1;
  long lVar2;
  float fVar3;
  
  lVar2 = 0;
  if (size < 1) {
    size = 0;
  }
  for (; size != (int)lVar2; lVar2 = lVar2 + 1) {
    fVar3 = roundf(ptr[lVar2] * scale);
    iVar1 = (int)fVar3;
    if (iVar1 < -0x7e) {
      iVar1 = -0x7f;
    }
    if (0x7e < iVar1) {
      iVar1 = 0x7f;
    }
    s8ptr[lVar2] = (char)iVar1;
  }
  return;
}

Assistant:

static void quantize(const float* ptr, signed char* s8ptr, float scale, int size)
{
    for (int i = 0; i < size; i++)
    {
        *s8ptr = float2int8(*ptr * scale);
        ptr++;
        s8ptr++;
    }
}